

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.c
# Opt level: O1

int main(void)

{
  int iVar1;
  char *pcVar2;
  long lVar3;
  char *pcVar4;
  bool bVar5;
  xdg_paths state;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  pcVar2 = (char *)xdg_get_path("XDG_CONFIG_HOME",".config");
  puts(pcVar2);
  free(pcVar2);
  pcVar2 = (char *)xdg_get_path("XDG_DATA_HOME",".local/share");
  puts(pcVar2);
  free(pcVar2);
  pcVar2 = (char *)xdg_get_path("XDG_CACHE_HOME",".cache");
  puts(pcVar2);
  free(pcVar2);
  pcVar2 = (char *)xdg_get_path("XDG_THIS_DOES_NOT_EXIST","but_mah_path_is_still_here");
  puts(pcVar2);
  free(pcVar2);
  local_48 = 0;
  uStack_40 = 0;
  local_38 = 0;
  lVar3 = xdg_get_paths("XDG_DATA_DIRS","/usr/share:/foo/bar:asd:/the/relative/got/skipped:asd",
                        &local_48,0xffffffff);
  while (lVar3 != 0) {
    printf("=> %s\n",lVar3);
    lVar3 = xdg_get_paths("XDG_DATA_DIRS","/usr/share:/foo/bar:asd:/the/relative/got/skipped:asd",
                          &local_48,0xffffffff);
  }
  setenv("XDG_CONFIG_HOME","/home/dir/.configs",1);
  pcVar2 = (char *)xdg_get_path("XDG_CONFIG_HOME","default_is_not_used");
  iVar1 = strcmp(pcVar2,"/home/dir/.configs");
  if (iVar1 != 0) {
    __assert_fail("!strcmp(ret, home)",
                  "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/xdg/test.c"
                  ,0x1f,"int main(void)");
  }
  free(pcVar2);
  unsetenv("XDG_CONFIG_HOME");
  pcVar2 = (char *)xdg_get_path("XDG_CONFIG_HOME","default_path");
  pcVar4 = strstr(pcVar2,"default_path");
  if (pcVar4 == (char *)0x0) {
    __assert_fail("strstr(ret, \"default_path\")",
                  "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/xdg/test.c"
                  ,0x27,"int main(void)");
  }
  free(pcVar2);
  setenv("XDG_CONFIG_HOME",anon_var_dwarf_1a7,1);
  pcVar2 = (char *)xdg_get_path("XDG_CONFIG_HOME","that_does_not_get_set");
  iVar1 = strcmp(pcVar2,anon_var_dwarf_1a7);
  if (iVar1 == 0) {
    __assert_fail("strcmp(ret, home)",
                  "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/xdg/test.c"
                  ,0x30,"int main(void)");
  }
  free(pcVar2);
  setenv("XDG_DATA_DIRS","/test:/test2:relative:/relative/skipped:/ignored/by/max/iter/arg",1);
  local_48 = 0;
  uStack_40 = 0;
  local_38 = 0;
  pcVar2 = (char *)xdg_get_paths("XDG_DATA_DIRS","/does:/not:/trigger",&local_48,3);
  if (pcVar2 != (char *)0x0) {
    lVar3 = 0;
    do {
      if ((lVar3 == 0xc) ||
         (iVar1 = strcmp(pcVar2,(char *)((long)&DAT_001022cc +
                                        (long)*(int *)((long)&DAT_001022cc + lVar3))), iVar1 != 0))
      {
        __assert_fail("i < 3 && !strcmp(path, paths[i])",
                      "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/xdg/test.c"
                      ,0x3d,"int main(void)");
      }
      pcVar2 = (char *)xdg_get_paths("XDG_DATA_DIRS","/does:/not:/trigger",&local_48,3);
      lVar3 = lVar3 + 4;
    } while (pcVar2 != (char *)0x0);
  }
  unsetenv("XDG_DATA_DIRS");
  local_48 = 0;
  uStack_40 = 0;
  local_38 = 0;
  bVar5 = true;
  do {
    pcVar2 = (char *)xdg_get_paths("XDG_DATA_DIRS","/default:relative:skip/path",&local_48,1);
    if (pcVar2 == (char *)0x0) {
      return 0;
    }
    if (!bVar5) break;
    iVar1 = strcmp(pcVar2,"/default");
    bVar5 = false;
  } while (iVar1 == 0);
  __assert_fail("i < 1 && !strcmp(path, paths[i])",
                "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/xdg/test.c",
                0x4b,"int main(void)");
}

Assistant:

int
main(void)
{
   // OUTPUT: current variables
   {
      char *ret;
      printf("%s\n", (ret = xdg_get_path("XDG_CONFIG_HOME", ".config"))); free(ret);
      printf("%s\n", (ret = xdg_get_path("XDG_DATA_HOME", ".local/share"))); free(ret);
      printf("%s\n", (ret = xdg_get_path("XDG_CACHE_HOME", ".cache"))); free(ret);
      printf("%s\n", (ret = xdg_get_path("XDG_THIS_DOES_NOT_EXIST", "but_mah_path_is_still_here"))); free(ret);

      const char *path;
      struct xdg_paths state = {0};
      while ((path = xdg_get_paths("XDG_DATA_DIRS", "/usr/share:/foo/bar:asd:/the/relative/got/skipped:asd", &state, -1)))
         printf("=> %s\n", path);
   }

   // TEST: good set
   {
      const char *home = "/home/dir/.configs" ;
      setenv("XDG_CONFIG_HOME", home, 1);
      char *ret = xdg_get_path("XDG_CONFIG_HOME", "default_is_not_used");
      assert(!strcmp(ret, home));
      free(ret);
   }

   // TEST: default value
   {
      unsetenv("XDG_CONFIG_HOME");
      char *ret = xdg_get_path("XDG_CONFIG_HOME", "default_path");
      assert(strstr(ret, "default_path"));
      free(ret);
   }

   // TEST: non relative
   {
      const char *home = "\\o// $24$@£ DID I SET MY CONFIG_HOME RIGHT!?" ;
      setenv("XDG_CONFIG_HOME", home, 1);
      char *ret = xdg_get_path("XDG_CONFIG_HOME", "that_does_not_get_set");
      assert(strcmp(ret, home));
      free(ret);
   }

   // TEST: good paths
   {
      int i = 0;
      const char *paths[3] = { "/test", "/test2", "/relative/skipped" };
      setenv("XDG_DATA_DIRS", "/test:/test2:relative:/relative/skipped:/ignored/by/max/iter/arg", 1);

      const char *path;
      struct xdg_paths state = {0};
      while ((path = xdg_get_paths("XDG_DATA_DIRS", "/does:/not:/trigger", &state, 3))) {
         assert(i < 3 && !strcmp(path, paths[i]));
         ++i;
      }
   }

   // TEST: default paths
   {
      int i = 0;
      const char *paths[1] = { "/default" };
      unsetenv("XDG_DATA_DIRS");

      const char *path;
      struct xdg_paths state = {0};
      while ((path = xdg_get_paths("XDG_DATA_DIRS", "/default:relative:skip/path", &state, 1))) {
         assert(i < 1 && !strcmp(path, paths[i]));
         ++i;
      }
   }

   return EXIT_SUCCESS;
}